

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
::_reduce_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
          *this,ID_index cellID,initializer_list<std::pair<unsigned_int,_unsigned_int>_> *boundary,
          Dimension dim)

{
  size_type sVar1;
  uint uVar2;
  Index IVar3;
  Column *pCVar4;
  anon_class_8_1_5062c494 get_last;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  chainsInH;
  Tmp_column column;
  Dimension local_a0;
  anon_class_8_1_5062c494 local_98;
  ID_index local_8c;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_88;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_68;
  int local_34;
  
  local_8c = cellID;
  std::
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::map<std::pair<unsigned_int,unsigned_int>const*>
            ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)&local_68,boundary->_M_array,boundary->_M_array + boundary->_M_len);
  sVar1 = boundary->_M_len;
  local_a0 = dim;
  if (dim == -1) {
    if (sVar1 == 0) {
      local_a0 = 0;
    }
    else {
      local_a0 = (int)sVar1 + -1;
    }
  }
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.column = (Tmp_column *)&local_68;
  if (sVar1 == 0) {
    local_34 = 1;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::_M_emplace_unique<unsigned_int&,int>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                *)&local_68,&local_8c,&local_34);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
    ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                     *)this,(Tmp_column *)&local_68,local_a0);
  }
  else {
    uVar2 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
            ::_reduce_boundary<std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>_>::
            anon_class_8_1_5062c494::operator()(&local_98);
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
            ::get_column_with_pivot
                      ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                        *)this,uVar2);
    while( true ) {
      pCVar4 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
               ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                             *)this,IVar3);
      if ((pCVar4->super_Chain_column_option).pairedColumn_ == 0xffffffff) break;
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
      ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                      *)this,(Tmp_column *)&local_68,
                     (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      *)&local_88,IVar3);
      if (local_68._M_impl.super__Rb_tree_header._M_node_count == 0) {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
        ::_build_from_H((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                         *)this,cellID,(Tmp_column *)&local_68,
                        (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&local_88);
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
        ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                         *)this,(Tmp_column *)&local_68,local_a0);
        goto LAB_00163bc2;
      }
      uVar2 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
              ::_reduce_boundary<std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>_>::
              anon_class_8_1_5062c494::operator()(&local_98);
      IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
              ::get_column_with_pivot
                        ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                          *)this,uVar2);
    }
    while (local_68._M_impl.super__Rb_tree_header._M_node_count != 0) {
      uVar2 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
              ::_reduce_boundary<std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>_>::
              anon_class_8_1_5062c494::operator()(&local_98);
      IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
              ::get_column_with_pivot
                        ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                          *)this,uVar2);
      pCVar4 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
               ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                             *)this,IVar3);
      if ((pCVar4->super_Chain_column_option).pairedColumn_ == 0xffffffff) {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
        ::_reduce_by_F((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                        *)this,(Tmp_column *)&local_68,__return_storage_ptr__,IVar3);
      }
      else {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
        ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                        *)this,(Tmp_column *)&local_68,
                       (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        *)&local_88,IVar3);
      }
    }
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
    ::_update_largest_death_in_F
              ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                *)this,__return_storage_ptr__);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
    ::_build_from_H((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                     *)this,cellID,(Tmp_column *)&local_68,
                    (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&local_88);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
    ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                     *)this,(Tmp_column *)&local_68,local_a0,
                    ((__return_storage_ptr__->
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->first);
  }
LAB_00163bc2:
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_88);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_68);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}